

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *this,
          size_t newSize)

{
  DataLocation *pDVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *pRVar2;
  DataLocation *pDVar3;
  size_t __n;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> local_38;
  
  pDVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pDVar1 >> 3)) {
    (this->builder).pos = pDVar1 + newSize;
  }
  pDVar3 = (DataLocation *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = pDVar3 + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pDVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pDVar1;
  local_38.ptr = pDVar3;
  if (__n != 0) {
    memcpy(pDVar3,pDVar1,__n);
  }
  local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)
                 ((long)pDVar3 + __n);
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::operator=
            (&this->builder,&local_38);
  pDVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pDVar1 = local_38.ptr;
  if (local_38.ptr != (DataLocation *)0x0) {
    local_38.ptr = (DataLocation *)0x0;
    local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>
                    *)0x0;
    local_38.endPtr = (DataLocation *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pDVar1,8,(long)pRVar2 - (long)pDVar1 >> 3,
               (long)pDVar3 - (long)pDVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }